

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O3

Arguments * __thiscall
Corrade::Utility::Arguments::setHelp(Arguments *this,string *key,string *help,string *helpKey)

{
  size_type *psVar1;
  ulong uVar2;
  Type TVar3;
  pointer pcVar4;
  Entry *pEVar5;
  long *plVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  Debug *pDVar9;
  ulong *puVar10;
  ulong uVar11;
  size_type sVar12;
  undefined1 local_a0 [40];
  Arguments *local_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &this->_prefix,key);
  local_78 = this;
  pEVar5 = find(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_);
  }
  if (pEVar5 == (Entry *)0x0) {
    poVar8 = Error::defaultOutput();
    Error::Error((Error *)local_a0,poVar8,(Flags)0x0);
    pDVar9 = Debug::operator<<((Debug *)local_a0,"Utility::Arguments::setHelp(): key");
    pDVar9 = Implementation::debugPrintStlString(pDVar9,key);
    Debug::operator<<(pDVar9,"not found");
LAB_00123401:
    Error::~Error((Error *)local_a0);
    abort();
  }
  std::__cxx11::string::operator=((string *)&pEVar5->help,(string *)help);
  if (helpKey->_M_string_length == 0) {
    return local_78;
  }
  TVar3 = pEVar5->type;
  if (2 < TVar3 - 2) {
    if (TVar3 < NamedArgument) {
      std::__cxx11::string::operator=((string *)&pEVar5->helpKey,(string *)helpKey);
      return local_78;
    }
    if (TVar3 == BooleanOption) {
      poVar8 = Error::defaultOutput();
      Error::Error((Error *)local_a0,poVar8,(Flags)0x0);
      pDVar9 = Debug::operator<<((Debug *)local_a0,
                                 "Utility::Arguments::setHelp(): help key can\'t be set for boolean option"
                                );
      operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (pDVar9,key);
    }
    else {
      poVar8 = Error::defaultOutput();
      Error::Error((Error *)local_a0,poVar8,(Flags)0x0);
      Debug::operator<<((Debug *)local_a0,
                        "Assertion found->type == Type::Argument || found->type == Type::ArrayArgument failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Arguments.cpp:468"
                       );
    }
    goto LAB_00123401;
  }
  std::operator+(&local_50,&this->_prefix,key);
  plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_50,local_50._M_string_length,0,'\x01');
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_60 = *puVar10;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar10;
    local_70 = (ulong *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar4 = (helpKey->_M_dataplus)._M_p;
  uVar2 = helpKey->_M_string_length + local_68;
  sVar12 = 0xf;
  uVar11 = local_60;
  if (local_70 == &local_60) {
    uVar11 = 0xf;
  }
  if (uVar11 < uVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &helpKey->field_2) {
      sVar12 = (helpKey->field_2)._M_allocated_capacity;
    }
    if (uVar2 <= sVar12) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)helpKey,0,(char *)0x0,(ulong)local_70);
      goto LAB_001232c5;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)pcVar4);
LAB_001232c5:
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    local_a0._16_8_ = *psVar1;
    local_a0._24_8_ = puVar7[3];
    local_a0._0_8_ = local_a0 + 0x10;
  }
  else {
    local_a0._16_8_ = *psVar1;
    local_a0._0_8_ = (size_type *)*puVar7;
  }
  local_a0._8_8_ = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(char *)psVar1 = '\0';
  std::__cxx11::string::operator=((string *)&pEVar5->helpKey,(string *)local_a0);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return local_78;
}

Assistant:

Arguments& Arguments::setHelp(const std::string& key, std::string help, std::string helpKey) {
    Entry* found = find(_prefix + key);
    CORRADE_ASSERT(found, "Utility::Arguments::setHelp(): key" << key << "not found", *this);

    found->help = std::move(help);

    if(!helpKey.empty()) {
        CORRADE_ASSERT(found->type != Type::BooleanOption,
            "Utility::Arguments::setHelp(): help key can't be set for boolean option" << key, *this);

        if(found->type == Type::NamedArgument || found->type == Type::Option || found->type == Type::ArrayOption)
            found->helpKey = _prefix + key + ' ' + std::move(helpKey);
        else {
            CORRADE_INTERNAL_ASSERT(found->type == Type::Argument || found->type == Type::ArrayArgument);
            found->helpKey = std::move(helpKey);
        }
    }

    return *this;
}